

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.cc
# Opt level: O1

int __thiscall wabt::string_view::copy(string_view *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  EVP_PKEY_CTX *pEVar1;
  ulong in_RCX;
  
  pEVar1 = (EVP_PKEY_CTX *)(this->size_ - in_RCX);
  if (in_RCX <= this->size_) {
    if (pEVar1 < src) {
      src = pEVar1;
    }
    if (src != (EVP_PKEY_CTX *)0x0) {
      memcpy(dst,this->data_ + in_RCX,(size_t)src);
    }
    return (int)src;
  }
  __assert_fail("pos <= size_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/string-view.cc"
                ,0x37,
                "string_view::size_type wabt::string_view::copy(char *, size_type, size_type) const"
               );
}

Assistant:

string_view::size_type string_view::copy(char* s,
                                         size_type n,
                                         size_type pos) const {
  assert(pos <= size_);
  size_t count = std::min(n, size_ - pos);
  traits_type::copy(s, data_ + pos, count);
  return count;
}